

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::SelectFlatLoopSwitch<double,double,duckdb::GreaterThan,false,false>
                (double *ldata,double *rdata,SelectionVector *sel,idx_t count,ValidityMask *mask,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  bool bVar2;
  idx_t iVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  sel_t sVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      iVar3 = SelectFlatLoop<double,double,duckdb::GreaterThan,false,false,false,true>
                        (ldata,rdata,sel,count,mask,(SelectionVector *)0x0,false_sel);
      return iVar3;
    }
    if (count + 0x3f < 0x40) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      uVar7 = 0;
      uVar10 = 0;
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar8 = 0xffffffffffffffff;
        }
        else {
          uVar8 = puVar1[uVar7];
        }
        uVar12 = uVar10 + 0x40;
        if (count <= uVar10 + 0x40) {
          uVar12 = count;
        }
        uVar11 = uVar12;
        if (uVar8 != 0) {
          uVar11 = uVar10;
          if (uVar8 == 0xffffffffffffffff) {
            if (uVar10 < uVar12) {
              pdVar5 = rdata + uVar10;
              pdVar6 = ldata + uVar10;
              do {
                uVar10 = uVar11;
                if (sel->sel_vector != (sel_t *)0x0) {
                  uVar10 = (ulong)sel->sel_vector[uVar11];
                }
                bVar2 = GreaterThan::Operation<double>(pdVar6,pdVar5);
                true_sel->sel_vector[iVar3] = (sel_t)uVar10;
                iVar3 = iVar3 + bVar2;
                uVar11 = uVar11 + 1;
                pdVar5 = pdVar5 + 1;
                pdVar6 = pdVar6 + 1;
              } while (uVar12 != uVar11);
            }
          }
          else if (uVar10 < uVar12) {
            pdVar5 = rdata + uVar10;
            pdVar6 = ldata + uVar10;
            uVar11 = 0;
            do {
              if (sel->sel_vector == (sel_t *)0x0) {
                sVar9 = (int)uVar10 + (int)uVar11;
              }
              else {
                sVar9 = sel->sel_vector[uVar10 + uVar11];
              }
              if ((uVar8 >> (uVar11 & 0x3f) & 1) == 0) {
                uVar4 = 0;
              }
              else {
                bVar2 = GreaterThan::Operation<double>(pdVar6,pdVar5);
                uVar4 = (ulong)bVar2;
              }
              true_sel->sel_vector[iVar3] = sVar9;
              iVar3 = iVar3 + uVar4;
              uVar11 = uVar11 + 1;
              pdVar5 = pdVar5 + 1;
              pdVar6 = pdVar6 + 1;
            } while ((uVar10 - uVar12) + uVar11 != 0);
            uVar11 = uVar10 + uVar11;
          }
        }
        uVar7 = uVar7 + 1;
        uVar10 = uVar11;
      } while (uVar7 != count + 0x3f >> 6);
    }
  }
  else {
    iVar3 = SelectFlatLoop<double,double,duckdb::GreaterThan,false,false,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
  }
  return iVar3;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}